

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O0

wchar_t mapglyph(nh_dbuf_entry_conflict *dbe,curses_symdef *syms,wchar_t *bg_color)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  wchar_t wVar4;
  wchar_t local_30;
  wchar_t count;
  wchar_t id;
  wchar_t *bg_color_local;
  curses_symdef *syms_local;
  nh_dbuf_entry_conflict *dbe_local;
  
  local_30 = L'\0';
  if (dbe->effect == L'\0') {
    if (dbe->invis == '\0') {
      if (dbe->mon != 0) {
        if ((cur_drawing->num_monsters < (int)dbe->mon) && ((dbe->monflags & 8U) != 0)) {
          memcpy(syms,cur_drawing->warnings + ((dbe->mon + -1) - cur_drawing->num_monsters),0x28);
        }
        else {
          memcpy(syms,cur_drawing->monsters + (dbe->mon + -1),0x28);
        }
        valley_symdef(syms);
        local_30 = L'\x01';
      }
    }
    else {
      memcpy(syms,cur_drawing->invis,0x28);
      valley_symdef(syms);
      local_30 = L'\x01';
    }
    if (dbe->obj != 0) {
      object_symdef(dbe->obj + L'\xffffffff',dbe->obj_mn + L'\xffffffff',syms + local_30);
      if ((dbe->objflags & 2U) != 0) {
        syms[local_30].color = 0xd;
      }
      valley_symdef(syms + local_30);
      if ((settings.darkroom != '\0') && ((dbe->dgnflags & 1U) == 0)) {
        darken_symdef(syms + local_30);
      }
      local_30 = local_30 + L'\x01';
    }
    if (dbe->trap != 0) {
      wVar4 = dbe->trap + L'\xffffffff';
      memcpy(syms + local_30,cur_drawing->traps + wVar4,0x28);
      valley_symdef(syms + local_30);
      if ((settings.darkroom != '\0') && ((dbe->dgnflags & 1U) == 0)) {
        darken_symdef(syms + local_30);
      }
      if ((wVar4 == mportal_id) || (wVar4 == vibsquare_id)) {
        *bg_color = L'\x01';
      }
      local_30 = local_30 + L'\x01';
    }
    if ((local_30 == L'\0') || (cur_drawing->bg_feature_offset <= (int)dbe->bg)) {
      memcpy(syms + local_30,cur_drawing->bgelements + dbe->bg,0x28);
      recolor_bg(dbe,syms + local_30);
      valley_symdef(syms + local_30);
      if ((settings.darkroom != '\0') && ((dbe->dgnflags & 1U) == 0)) {
        darken_symdef(syms + local_30);
      }
      local_30 = local_30 + L'\x01';
    }
    if (((((dbe->bg == upstair_id) || (dbe->bg == dnstair_id)) || (dbe->bg == upladder_id)) ||
        ((dbe->bg == dnladder_id || (dbe->bg == upsstair_id)))) || (dbe->bg == dnsstair_id)) {
      *bg_color = L'\x01';
    }
    if ((dbe->mon != 0) || (dbe->invis != '\0')) {
      *bg_color = L'\0';
    }
    dbe_local._4_4_ = local_30;
  }
  else {
    uVar1 = dbe->effect + L'\xffffffff';
    uVar2 = uVar1 & 0xffff;
    uVar3 = (uint)*(short *)((long)&dbe->effect + 2);
    if (uVar3 < 5) {
      switch(uVar3) {
      case 0:
        memcpy(syms,cur_drawing->explsyms + (int)(uVar2 % 9),0x28);
        syms->color = cur_drawing->expltypes[(int)(uVar2 / 9)].color;
        break;
      case 1:
        memcpy(syms,cur_drawing->swallowsyms + (int)(uVar1 & 7),0x28);
        syms->color = cur_drawing->monsters[(int)uVar2 >> 3].color;
        break;
      case 2:
        memcpy(syms,cur_drawing->zapsyms + (int)(uVar1 & 3),0x28);
        syms->color = cur_drawing->zaptypes[(int)uVar2 >> 2].color;
        break;
      case 3:
        memcpy(syms,cur_drawing->breathsyms + (int)(uVar1 & 3),0x28);
        syms->color = cur_drawing->zaptypes[(int)uVar2 >> 2].color;
        break;
      case 4:
        memcpy(syms,cur_drawing->effects + (int)uVar2,0x28);
        syms->color = cur_drawing->effects[(int)uVar2].color;
      }
    }
    valley_symdef(syms);
    dbe_local._4_4_ = L'\x01';
  }
  return dbe_local._4_4_;
}

Assistant:

int mapglyph(struct nh_dbuf_entry *dbe, struct curses_symdef *syms, int *bg_color)
{
    int id, count = 0;

    if (dbe->effect) {
	id = NH_EFFECT_ID(dbe->effect);

	switch (NH_EFFECT_TYPE(dbe->effect)) {
	    case E_EXPLOSION:
		syms[0] = cur_drawing->explsyms[id % NUMEXPCHARS];
		syms[0].color = cur_drawing->expltypes[id / NUMEXPCHARS].color;
		break;

	    case E_SWALLOW:
		syms[0] = cur_drawing->swallowsyms[id & 0x7];
		syms[0].color = cur_drawing->monsters[id >> 3].color;
		break;

	    case E_ZAP:
		syms[0] = cur_drawing->zapsyms[id & 0x3];
		syms[0].color = cur_drawing->zaptypes[id >> 2].color;
		break;

	    case E_BREATH:
		syms[0] = cur_drawing->breathsyms[id & 0x3];
		syms[0].color = cur_drawing->zaptypes[id >> 2].color;
		break;

	    case E_MISC:
		syms[0] = cur_drawing->effects[id];
		syms[0].color = cur_drawing->effects[id].color;
		break;
	}

	valley_symdef(&syms[0]);

	return 1; /* we don't want to show other glyphs under effects */
    }
    
    if (dbe->invis) {
	syms[count] = cur_drawing->invis[0];
	valley_symdef(&syms[count]);
	count++;
    } else if (dbe->mon) {
	if (dbe->mon > cur_drawing->num_monsters && (dbe->monflags & MON_WARNING)) {
	    id = dbe->mon - 1 - cur_drawing->num_monsters;
	    syms[count] = cur_drawing->warnings[id];
	} else {
	    id = dbe->mon - 1;
	    syms[count] = cur_drawing->monsters[id];
	}
	valley_symdef(&syms[count]);
	count++;
    }
    
    if (dbe->obj) {
	object_symdef(dbe->obj - 1, dbe->obj_mn - 1, &syms[count]);

	if (dbe->objflags & DOBJ_PRIZE)
	    syms[count].color = CLR_BRIGHT_MAGENTA;
	valley_symdef(&syms[count]);
	if (settings.darkroom && !(dbe->dgnflags & NH_DF_VISIBLE_MASK))
	    darken_symdef(&syms[count]);

	count++;
    }
    
    if (dbe->trap) {
	id = dbe->trap - 1;
	syms[count] = cur_drawing->traps[id];

	valley_symdef(&syms[count]);
	if (settings.darkroom && !(dbe->dgnflags & NH_DF_VISIBLE_MASK))
	    darken_symdef(&syms[count]);

	if (id == mportal_id || id == vibsquare_id)
	    *bg_color = CLR_RED;

	count++;
    } 
    
    /* omit the background symbol from the list if it is boring */
    if (count == 0 || dbe->bg >= cur_drawing->bg_feature_offset) {
	syms[count] = cur_drawing->bgelements[dbe->bg];
	recolor_bg(dbe, &syms[count]);
	valley_symdef(&syms[count]);
	if (settings.darkroom && !(dbe->dgnflags & NH_DF_VISIBLE_MASK))
	    darken_symdef(&syms[count]);
	count++;
    }

    if (dbe->bg == upstair_id  || dbe->bg == dnstair_id  ||
	dbe->bg == upladder_id || dbe->bg == dnladder_id ||
	dbe->bg == upsstair_id || dbe->bg == dnsstair_id) {
	*bg_color = CLR_RED;
    }

    /* monsters override background color, NAO-style */
    if (dbe->mon || dbe->invis)
	*bg_color = 0;

    return count; /* count <= 4 */
}